

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_service.hpp
# Opt level: O1

results_type * __thiscall
asio::detail::resolver_service<asio::ip::tcp>::resolve
          (results_type *__return_storage_ptr__,resolver_service<asio::ip::tcp> *this,
          implementation_type *param_1,query_type *qry,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  addrinfo *address_info_00;
  int error;
  int *piVar4;
  _Alloc_hider _Var5;
  _Alloc_hider __name;
  error_code eVar6;
  addrinfo_type *address_info;
  string local_78;
  string local_58;
  addrinfo *local_38;
  
  local_38 = (addrinfo *)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar3 = (qry->host_name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + (qry->host_name_)._M_string_length);
  _Var5._M_p = local_78._M_dataplus._M_p;
  paVar1 = &local_58.field_2;
  pcVar3 = (qry->service_name_)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (qry->service_name_)._M_string_length);
  __name._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)_Var5._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0) && (*_Var5._M_p != '\0')) {
    __name._M_p = _Var5._M_p;
  }
  _Var5._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_58._M_dataplus._M_p !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0) && (*local_58._M_dataplus._M_p != '\0')) {
    _Var5._M_p = local_58._M_dataplus._M_p;
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  error = getaddrinfo(__name._M_p,_Var5._M_p,(addrinfo *)qry,&local_38);
  eVar6 = socket_ops::translate_addrinfo_error(error);
  ec->_M_value = eVar6._M_value;
  ec->_M_cat = eVar6._M_cat;
  paVar2 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  address_info_00 = local_38;
  if (ec->_M_value == 0) {
    pcVar3 = (qry->host_name_)._M_dataplus._M_p;
    local_78._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,pcVar3 + (qry->host_name_)._M_string_length);
    pcVar3 = (qry->service_name_)._M_dataplus._M_p;
    local_58._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,pcVar3 + (qry->service_name_)._M_string_length);
    ip::basic_resolver_results<asio::ip::tcp>::create
              (__return_storage_ptr__,(addrinfo_type *)address_info_00,&local_78,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).values_.
    super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->super_basic_resolver_iterator<asio::ip::tcp>).index_ = 0;
  }
  if (address_info_00 != (addrinfo *)0x0) {
    freeaddrinfo(address_info_00);
  }
  return __return_storage_ptr__;
}

Assistant:

results_type resolve(implementation_type&, const query_type& qry,
      asio::error_code& ec)
  {
    asio::detail::addrinfo_type* address_info = 0;

    socket_ops::getaddrinfo(qry.host_name().c_str(),
        qry.service_name().c_str(), qry.hints(), &address_info, ec);
    auto_addrinfo auto_address_info(address_info);

    return ec ? results_type() : results_type::create(
        address_info, qry.host_name(), qry.service_name());
  }